

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O0

DdNode * Cudd_zddPortFromBdd(DdManager *dd,DdNode *B)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *B_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = zddPortFromBddStep(dd,B,0);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddPortFromBdd(
  DdManager * dd,
  DdNode * B)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = zddPortFromBddStep(dd,B,0);
    } while (dd->reordered == 1);

    return(res);

}